

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O0

void GvEv(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
  }
  else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
    (pMyDisasm->Reserved_).MemDecoration = 0x67;
  }
  else {
    (pMyDisasm->Reserved_).MemDecoration = 0x66;
  }
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
  return;
}

Assistant:

void __bea_callspec__ GvEv(PDISASM pMyDisasm)
{
  if (GV.OperandSize == 64) {
    GV.MemDecoration = Arg2qword;
  }
  else if (GV.OperandSize == 32) {
    GV.MemDecoration = Arg2dword;
  }
  else {
    GV.MemDecoration = Arg2word;
  }
  decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
  decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
  GV.EIP_ += GV.DECALAGE_EIP+2;
}